

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

Vector<float,_3,_true> __thiscall
Nova::Image<float>::Byte_Color_To_Scalar_Color<3>
          (Image<float> *this,Vector<unsigned_char,_3,_true> *color_in)

{
  T_STORAGE TVar1;
  Vector<float,_3,_true> local_4c;
  float local_40;
  Nova local_3c [12];
  Vector<float,_3,_true> local_30;
  Vector<float,_3,_true> local_24;
  Vector<unsigned_char,_3,_true> *local_18;
  Vector<unsigned_char,_3,_true> *color_in_local;
  
  local_18 = color_in;
  color_in_local = (Vector<unsigned_char,_3,_true> *)this;
  Vector<float,_3,_true>::Vector<unsigned_char>(&local_30,color_in);
  local_40 = 0.5;
  Vector<float,_3,_true>::Vector(&local_4c,1.0);
  Nova::operator*(local_3c,&local_40,&local_4c);
  Vector<float,_3,_true>::operator+(&local_24,&local_30);
  TVar1._M_elems = (_Type)Vector<float,_3,_true>::operator/((Vector<float,_3,_true> *)this,256.0);
  return (T_STORAGE)(T_STORAGE)TVar1._M_elems;
}

Assistant:

static Vector<T,d> Byte_Color_To_Scalar_Color(const Vector<unsigned char,d>& color_in)
    {return (Vector<T,d>(color_in)+(T).5*Vector<T,d>(1))/(T)256;}